

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void clunk::InitRookMoves(int from)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong map;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint to;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x21b,"void clunk::InitRookMoves(const int)");
  }
  lVar6 = 0;
  iVar5 = 0;
  map = 0;
  do {
    if (lVar6 == 4) {
      bVar2 = VerifyMoveMap(from,map);
      if (bVar2) {
        (&DAT_00165890)[(uint)from] = map;
        return;
      }
      __assert_fail("VerifyMoveMap(from, mvs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x22d,"void clunk::InitRookMoves(const int)");
    }
    iVar1 = (&DAT_001410c0)[lVar6];
    if ((from + iVar1 & 0xffffff88U) == 0) {
      to = from;
      do {
        uVar4 = iVar1 * 2 + to;
        to = to + iVar1;
      } while ((uVar4 & 0xffffff88) == 0);
      if ((to & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(end)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x226,"void clunk::InitRookMoves(const int)");
      }
      iVar3 = Direction(from,to);
      if (iVar3 != iVar1) {
        __assert_fail("Direction(from, end) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x227,"void clunk::InitRookMoves(const int)");
      }
      if (0x18 < iVar5) {
        __assert_fail("shift <= 24",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x228,"void clunk::InitRookMoves(const int)");
      }
      map = map | (ulong)(to + 1) << ((byte)iVar5 & 0x3f);
      iVar5 = iVar5 + 8;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void InitRookMoves(const int from) {
  assert(IS_SQUARE(from));
  const int DIRECTION[4] = {
    South, West, East, North
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 4; ++i) {
    const int dir = DIRECTION[i];
    int end = (from + dir);
    if (IS_SQUARE(end)) {
      while (IS_SQUARE(end + dir)) end += dir;
      assert(IS_SQUARE(end));
      assert(Direction(from, end) == dir);
      assert(shift <= 24);
      mvs |= (uint64_t(end + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _bishopRook[from + 8] = mvs;
}